

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void test_init_start_stop_destroy_multiple_streams(int early,int delay_ms)

{
  bool bVar1;
  char *pcVar2;
  void **ppvVar3;
  size_t sVar4;
  int in_ESI;
  int in_EDI;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  cubeb_stream_params params;
  cubeb_stream *stream [8];
  cubeb *ctx;
  int r;
  size_t i;
  cubeb_stream *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  code *in_stack_fffffffffffffdf8;
  code *in_stack_fffffffffffffe00;
  int *in_stack_fffffffffffffe08;
  void **in_stack_fffffffffffffe30;
  void **ppvVar5;
  AssertHelper in_stack_fffffffffffffe38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  char *in_stack_fffffffffffffe50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe58;
  AssertHelper in_stack_fffffffffffffe60;
  Message local_198;
  undefined4 local_18c;
  AssertionResult local_188;
  AssertHelper local_178;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe98;
  cubeb_data_callback in_stack_fffffffffffffea0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  AssertHelper in_stack_fffffffffffffeb0;
  Message local_148;
  undefined4 local_13c;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined8 local_118;
  AssertionResult local_110;
  AssertHelper local_100;
  Message local_f8;
  undefined4 local_ec;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined8 local_c8;
  AssertionResult local_c0;
  uint local_ac;
  AssertHelper local_a8;
  Message local_a0;
  undefined4 local_94;
  AssertionResult local_90;
  cubeb_stream local_7c;
  undefined4 local_6c;
  cubeb_stream *local_68 [9];
  int local_1c;
  void **local_18;
  int local_10;
  int local_c;
  
  local_10 = in_ESI;
  local_c = in_EDI;
  local_1c = common_init((cubeb **)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
  local_94 = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
             (int *)in_stack_fffffffffffffdf8,
             (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10b206);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,0x119,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message((Message *)0x10b256);
  }
  local_ac = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b27b);
  if (local_ac == 0) {
    local_c8 = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
               (char *)in_stack_fffffffffffffe40.ptr_,(cubeb **)in_stack_fffffffffffffe38.data_,
               in_stack_fffffffffffffe30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10b2f3);
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,0x11a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      testing::Message::~Message((Message *)0x10b343);
    }
    local_ac = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b368);
    if (local_ac == 0) {
      local_7c.context._0_4_ = 0;
      local_7c.context._4_4_ = 0xac44;
      local_7c.user_ptr._0_4_ = 1;
      local_7c.user_ptr._4_4_ = 4;
      local_6c = 0;
      local_18 = (void **)0x0;
      while (ppvVar5 = local_18,
            ppvVar3 = (void **)ARRAY_LENGTH<cubeb_stream*,8ul>((cubeb_stream *(*) [8])local_68),
            ppvVar5 < ppvVar3) {
        in_stack_fffffffffffffde8 = &local_7c;
        in_stack_fffffffffffffdf0 = 0x113a;
        in_stack_fffffffffffffdf8 = test_data_callback;
        in_stack_fffffffffffffe00 = test_state_callback;
        in_stack_fffffffffffffe08 = &dummy;
        local_1c = cubeb_stream_init((cubeb *)in_stack_fffffffffffffe60.data_,
                                     (cubeb_stream **)in_stack_fffffffffffffe58.ptr_,
                                     in_stack_fffffffffffffe50,
                                     (cubeb_devid)
                                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                     (cubeb_stream_params *)in_stack_fffffffffffffe40.ptr_,
                                     in_stack_fffffffffffffe38.data_,
                                     (cubeb_stream_params *)in_stack_fffffffffffffe90.ptr_,
                                     in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
                                     (cubeb_state_callback)in_stack_fffffffffffffea8.ptr_,
                                     in_stack_fffffffffffffeb0.data_);
        local_ec = 0;
        testing::internal::EqHelper<false>::Compare<int,__0>
                  ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                   (int *)in_stack_fffffffffffffdf8,
                   (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10b4c2);
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                     ,0x125,pcVar2);
          testing::internal::AssertHelper::operator=(&local_100,&local_f8);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          testing::Message::~Message((Message *)0x10b512);
        }
        local_ac = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b537);
        if (local_ac != 0) {
          return;
        }
        local_118 = 0;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  ((char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                   (char *)in_stack_fffffffffffffe40.ptr_,
                   (cubeb_stream **)in_stack_fffffffffffffe38.data_,ppvVar5);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10b5be);
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                     ,0x126,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          testing::Message::~Message((Message *)0x10b60e);
        }
        local_ac = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b633);
        if (local_ac != 0) {
          return;
        }
        if (local_c != 0) {
          local_1c = cubeb_stream_start(in_stack_fffffffffffffde8);
          local_13c = 0;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                     (int *)in_stack_fffffffffffffdf8,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe00);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10b6d4);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffeb0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                       ,0x129,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffeb0,&local_148);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb0)
            ;
            testing::Message::~Message((Message *)0x10b724);
          }
          local_ac = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b749);
          if (local_ac != 0) {
            return;
          }
        }
        local_18 = (void **)((long)local_18 + 1);
      }
      if (local_c == 0) {
        for (local_18 = (void **)0x0; ppvVar5 = local_18,
            ppvVar3 = (void **)ARRAY_LENGTH<cubeb_stream*,8ul>((cubeb_stream *(*) [8])local_68),
            ppvVar5 < ppvVar3; local_18 = (void **)((long)local_18 + 1)) {
          local_1c = cubeb_stream_start(in_stack_fffffffffffffde8);
          testing::internal::EqHelper<false>::Compare<int,__0>
                    ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                     (int *)in_stack_fffffffffffffdf8,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffea0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe00);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10b83e);
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                       ,0x130,pcVar2);
            testing::internal::AssertHelper::operator=
                      (&local_178,(Message *)&stack0xfffffffffffffe90);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            testing::Message::~Message((Message *)0x10b88e);
          }
          local_ac = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b8b3);
          if (local_ac != 0) {
            return;
          }
        }
      }
      if (local_10 != 0) {
        delay(0);
      }
      if (local_c == 0) {
        for (local_18 = (void **)0x0; ppvVar5 = local_18,
            sVar4 = ARRAY_LENGTH<cubeb_stream*,8ul>((cubeb_stream *(*) [8])local_68),
            ppvVar5 < sVar4; local_18 = (void **)((long)local_18 + 1)) {
          local_1c = cubeb_stream_stop(in_stack_fffffffffffffde8);
          local_18c = 0;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                     (int *)in_stack_fffffffffffffdf8,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe00);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10b9be);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffe60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                       ,0x13b,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffe60,&local_198);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe60)
            ;
            testing::Message::~Message((Message *)0x10ba05);
          }
          local_ac = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ba2a);
          if (local_ac != 0) {
            return;
          }
        }
      }
      for (local_18 = (void **)0x0; ppvVar5 = local_18,
          sVar4 = ARRAY_LENGTH<cubeb_stream*,8ul>((cubeb_stream *(*) [8])local_68), ppvVar5 < sVar4;
          local_18 = (void **)((long)local_18 + 1)) {
        if (local_c != 0) {
          local_1c = cubeb_stream_stop(in_stack_fffffffffffffde8);
          testing::internal::EqHelper<false>::Compare<int,__0>
                    ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                     (int *)in_stack_fffffffffffffdf8,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffe50);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe00);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10bb0d);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffe38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                       ,0x142,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffe38,(Message *)&stack0xfffffffffffffe40)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe38)
            ;
            testing::Message::~Message((Message *)0x10bb4e);
          }
          local_ac = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bb70);
          if (local_ac != 0) {
            return;
          }
        }
        cubeb_stream_destroy((cubeb_stream *)0x10bb96);
      }
      cubeb_destroy((cubeb *)0x10bbbc);
    }
  }
  return;
}

Assistant:

static void
test_init_start_stop_destroy_multiple_streams(int early, int delay_ms)
{
  size_t i;
  int r;
  cubeb * ctx;
  cubeb_stream * stream[8];
  cubeb_stream_params params;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
    r = cubeb_stream_init(ctx, &stream[i], "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                          test_data_callback, test_state_callback, &dummy);
    ASSERT_EQ(r, CUBEB_OK);
    ASSERT_NE(stream[i], nullptr);
    if (early) {
      r = cubeb_stream_start(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  if (!early) {
    for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
      r = cubeb_stream_start(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  if (delay_ms) {
    delay(delay_ms);
  }

  if (!early) {
    for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
      r = cubeb_stream_stop(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
    if (early) {
      r = cubeb_stream_stop(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
    cubeb_stream_destroy(stream[i]);
  }

  cubeb_destroy(ctx);
}